

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O1

size_t ascii2dw(uint8_t *string)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  byte bVar4;
  
  sVar1 = strlen((char *)string);
  if ((int)sVar1 < 1) {
    sVar3 = 0;
  }
  else {
    bVar4 = 0;
    do {
      lVar2 = 0;
      do {
        if ((uint)string[bVar4] ==
            (int)"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ[]\'*>_:=_.,-_?!;)(``/\'___________ \n"
                 [lVar2]) {
          string[bVar4] = (uint8_t)lVar2;
          break;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x61);
      bVar4 = bVar4 + 1;
      sVar3 = (size_t)bVar4;
    } while ((int)(uint)bVar4 < (int)sVar1);
  }
  return sVar3;
}

Assistant:

size_t ascii2dw(uint8_t *string)
{
    uint8_t i, j;
    int len, alphalen;

    len = strlen((char*)string);
    alphalen = strlen(alphabet);
    for (i=0; i < len; i++) {
        for (j=0; j < alphalen; j++) {
            if (string[i] == alphabet[j]) {
                string[i] = j;
                break;
            }
        }
    }
    return i;
}